

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_number_to_string.c
# Opt level: O0

size_t cesl_uint64_to_str(uint64_t value,char *dst_str,uint8_t base)

{
  char cVar1;
  size_t sVar2;
  ptrdiff_t len;
  char **ppcStack_70;
  int8_t index;
  char *pos;
  char buffer [65];
  char *pcStack_18;
  uint8_t base_local;
  char *dst_str_local;
  uint64_t value_local;
  
  dst_str_local = (char *)value;
  for (ppcStack_70 = &pos; dst_str_local != (char *)0x0 || ppcStack_70 == &pos;
      ppcStack_70 = (char **)((long)ppcStack_70 + 1)) {
    cVar1 = (char)((ulong)dst_str_local % (ulong)base);
    dst_str_local = (char *)((ulong)dst_str_local / (ulong)base);
    if (cVar1 < '\n') {
      *(char *)ppcStack_70 = cVar1 + '0';
    }
    else {
      *(char *)ppcStack_70 = cVar1 + 'W';
    }
  }
  sVar2 = (long)ppcStack_70 - (long)&pos;
  pcStack_18 = dst_str;
  if ((long)sVar2 < 1) {
    __assert_fail("(len > 0)&&(\"cesl_uint64_to_str negative lenght\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/cesl/cesl_strings/cesl_number_to_string.c"
                  ,0x91,"size_t cesl_uint64_to_str(uint64_t, char *, uint8_t)");
  }
  while (&pos < ppcStack_70) {
    ppcStack_70 = (char **)((long)ppcStack_70 + -1);
    *pcStack_18 = *(char *)ppcStack_70;
    pcStack_18 = pcStack_18 + 1;
  }
  *pcStack_18 = '\0';
  return sVar2;
}

Assistant:

size_t cesl_uint64_to_str(uint64_t value, char* dst_str, uint8_t base)
{
    char buffer[sizeof(uint64_t)*8+1];// be careful with the length of the buffer
    char* pos = buffer;

    while (value || pos == buffer) {
        int8_t index = (int8_t)(value % base);
        value /= base; // v/=radix uses less CPU clocks than v=v/radix does
        if (index < 10) {
            *pos = index+'0';
            ++pos;
        }
        else {
            *pos = index + 'a' - 10;
            ++pos;
        }
    }

    ptrdiff_t len = pos - buffer;
    cesl_assert(len > 0, "cesl_uint64_to_str negative lenght");

    while (pos > buffer) {
        --pos;
        *dst_str = *pos;
        ++dst_str;
    }

    *dst_str = '\0';
    return (size_t)len;
}